

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::checkStageIO(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  bool bVar1;
  int iVar2;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0> *p_Var5;
  _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1> *p_Var6;
  long lVar7;
  _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1> *p_Var8;
  _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0> *p_Var9;
  _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1> *p_Var10
  ;
  _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0> *p_Var11
  ;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var12;
  TIntermSequence unitLinkerObjects;
  TIntermSequence linkerObjects;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> local_70;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> local_50;
  
  if (unit->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  if (this->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  pTVar3 = findLinkerObjects(this);
  iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar3);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::vector
            (&local_50,
             (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             CONCAT44(extraout_var,iVar2));
  pTVar3 = findLinkerObjects(unit);
  iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar3);
  _Var12._M_current = (TIntermNode **)CONCAT44(extraout_var_00,iVar2);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::vector
            (&local_70,
             (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)_Var12._M_current);
  lVar4 = (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  p_Var9 = (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
            *)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  for (lVar7 = lVar4 >> 5; p_Var5 = p_Var9,
      p_Var11 = (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
                 *)local_50.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var9,_Var12);
    if (bVar1) goto LAB_002fdec3;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var9 + 8,_Var12);
    p_Var5 = p_Var9 + 8;
    if (bVar1) goto LAB_002fdec3;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var9 + 0x10,_Var12);
    p_Var5 = p_Var9 + 0x10;
    if (bVar1) goto LAB_002fdec3;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var9 + 0x18,_Var12);
    p_Var5 = p_Var9 + 0x18;
    if (bVar1) goto LAB_002fdec3;
    p_Var9 = p_Var9 + 0x20;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_002fdeb2:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
            ::operator()(p_Var9,_Var12);
    p_Var5 = p_Var9;
    if (!bVar1) {
      p_Var5 = (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
                *)local_50.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
    }
LAB_002fdec3:
    p_Var9 = p_Var5;
    if (p_Var5 != (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
                   *)local_50.
                     super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish) {
      while (p_Var9 = p_Var9 + 8, p_Var11 = p_Var5,
            p_Var9 != (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
                       *)local_50.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
                ::operator()(p_Var9,_Var12);
        if (!bVar1) {
          *(undefined8 *)p_Var5 = *(undefined8 *)p_Var9;
          p_Var5 = p_Var5 + 8;
        }
      }
    }
  }
  else {
    if (lVar4 == 2) {
LAB_002fdea2:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
              ::operator()(p_Var9,_Var12);
      p_Var5 = p_Var9;
      if (!bVar1) {
        p_Var9 = p_Var9 + 8;
        goto LAB_002fdeb2;
      }
      goto LAB_002fdec3;
    }
    if (lVar4 == 3) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_0>
              ::operator()(p_Var9,_Var12);
      if (!bVar1) {
        p_Var9 = p_Var9 + 8;
        goto LAB_002fdea2;
      }
      goto LAB_002fdec3;
    }
  }
  _Var12._M_current =
       (TIntermNode **)
       ((long)p_Var11 -
        (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
            (&local_50,(size_type)_Var12._M_current);
  lVar4 = (long)local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  p_Var10 = (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1>
             *)local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  for (lVar7 = lVar4 >> 5; p_Var6 = p_Var10,
      p_Var8 = (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1>
                *)local_70.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10,_Var12);
    if (bVar1) goto LAB_002fdfc4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10 + 8,_Var12);
    p_Var6 = p_Var10 + 8;
    if (bVar1) goto LAB_002fdfc4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10 + 0x10,_Var12);
    p_Var6 = p_Var10 + 0x10;
    if (bVar1) goto LAB_002fdfc4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10 + 0x18,_Var12);
    p_Var6 = p_Var10 + 0x18;
    if (bVar1) goto LAB_002fdfc4;
    p_Var10 = p_Var10 + 0x20;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_002fdfa9:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10,_Var12);
    p_Var6 = p_Var10;
    if (!bVar1) {
      p_Var6 = (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1>
                *)local_70.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
    }
  }
  else if (lVar4 == 2) {
LAB_002fdf99:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10,_Var12);
    p_Var6 = p_Var10;
    if (!bVar1) {
      p_Var10 = p_Var10 + 8;
      goto LAB_002fdfa9;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_002fdff1;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
            ::operator()(p_Var10,_Var12);
    if (!bVar1) {
      p_Var10 = p_Var10 + 8;
      goto LAB_002fdf99;
    }
  }
LAB_002fdfc4:
  p_Var10 = p_Var6;
  if (p_Var6 != (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1>
                 *)local_70.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
    while (p_Var10 = p_Var10 + 8, p_Var8 = p_Var6,
          p_Var10 !=
          (_Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1>
           *)local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::$_1>
              ::operator()(p_Var10,_Var12);
      if (!bVar1) {
        *(undefined8 *)p_Var6 = *(undefined8 *)p_Var10;
        p_Var6 = p_Var6 + 8;
      }
    }
  }
LAB_002fdff1:
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
            (&local_70,
             (long)p_Var8 -
             (long)local_70.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  mergeLinkerObjects(this,infoSink,(TIntermSequence *)&local_50,(TIntermSequence *)&local_70,
                     unit->language);
  return;
}

Assistant:

void TIntermediate::checkStageIO(TInfoSink& infoSink, TIntermediate& unit) {
    if (unit.treeRoot == nullptr || treeRoot == nullptr)
        return;

    // Get copies of the linker-object lists
    TIntermSequence linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // filter linkerObjects to only contain out variables
    auto end = std::remove_if(linkerObjects.begin(), linkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqVaryingOut; });
    linkerObjects.resize(end - linkerObjects.begin());

    // filter unitLinkerObjects to only contain in variables
    auto unitEnd = std::remove_if(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqVaryingIn; });
    unitLinkerObjects.resize(unitEnd - unitLinkerObjects.begin());

    // do matching and error checking
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());

    // TODO: final check; make sure that any statically used `in` have matching `out` written to
}